

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O3

string * __thiscall
cmInstallDirectoryGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallDirectoryGenerator *this,string *config)

{
  Snapshot snapshot;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  cmGeneratorExpression ge;
  allocator local_f1;
  undefined1 local_f0 [32];
  long local_d0;
  cmListFileBacktrace local_c8;
  cmGeneratorExpression local_88;
  Snapshot local_48;
  
  cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0);
  local_f0._8_8_ = 0;
  local_f0[0x10] = '\0';
  local_d0 = 0;
  snapshot.Position.Tree = local_48.Position.Tree;
  snapshot.State = local_48.State;
  snapshot.Position.Position = local_48.Position.Position;
  local_f0._0_8_ = (cmCompiledGeneratorExpression *)(local_f0 + 0x10);
  cmListFileBacktrace::cmListFileBacktrace(&local_c8,snapshot,(cmCommandContext *)local_f0);
  cmGeneratorExpression::cmGeneratorExpression(&local_88,&local_c8);
  cmListFileBacktrace::~cmListFileBacktrace(&local_c8);
  if ((cmCompiledGeneratorExpression *)local_f0._0_8_ !=
      (cmCompiledGeneratorExpression *)(local_f0 + 0x10)) {
    operator_delete((void *)local_f0._0_8_,CONCAT71(local_f0._17_7_,local_f0[0x10]) + 1);
  }
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_f0,(string *)&local_88);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&local_c8.Context + 0x10);
  local_c8.Context.Name._M_string_length = 0;
  local_c8.Context.Name.field_2._M_local_buf[0] = '\0';
  local_c8.Context.Name._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)local_f0._0_8_,this->LocalGenerator,config,
                      false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,(string *)&local_c8);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_f1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.Context.Name._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.Context.Name._M_dataplus._M_p,
                    CONCAT71(local_c8.Context.Name.field_2._M_allocated_capacity._1_7_,
                             local_c8.Context.Name.field_2._M_local_buf[0]) + 1);
  }
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_f0);
  cmGeneratorExpression::~cmGeneratorExpression(&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmInstallDirectoryGenerator::GetDestination(std::string const& config) const
{
  cmGeneratorExpression ge;
  return ge.Parse(this->Destination)
    ->Evaluate(this->LocalGenerator, config);
}